

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O1

leaf_type_help * __thiscall
tcmalloc::FixedAllocator<tcmalloc::PageMap::leaf_type_help>::Alloc
          (FixedAllocator<tcmalloc::PageMap::leaf_type_help> *this)

{
  void *result;
  leaf_type_help *plVar1;
  
  if (this->inited == false) {
    if (this->construct == false) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/fixed_allocator.hpp"
                    ,0x18,
                    "T *tcmalloc::FixedAllocator<tcmalloc::PageMap::leaf_type_help>::Alloc() [T = tcmalloc::PageMap::leaf_type_help]"
                   );
    }
    this->area_ = (char *)0x0;
    this->area_free_ = 0;
    this->freelist_ = (void *)0x0;
    this->inited = true;
  }
  plVar1 = (leaf_type_help *)this->freelist_;
  if (plVar1 != (leaf_type_help *)0x0) {
    this->freelist_ = plVar1->ptrs[0];
    return plVar1;
  }
  plVar1 = AllocFromArea(this);
  return plVar1;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }